

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O0

string * trim(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  size_t found;
  allocator<char> local_39;
  string local_38 [8];
  string pattern;
  string *str_local;
  string *ret;
  
  pattern.field_2._8_8_ = str;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38," \t\f\v\n\r",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pattern.field_2._8_8_);
  lVar1 = std::__cxx11::string::find_last_not_of((string *)__return_storage_ptr__,(ulong)local_38);
  if (lVar1 == -1) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar1 + 1);
  }
  lVar1 = std::__cxx11::string::find_first_not_of((string *)__return_storage_ptr__,(ulong)local_38);
  if (lVar1 == -1) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  }
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string trim(const std::string &str)
{
	const std::string pattern = " \t\f\v\n\r";
	std::string ret = str;
	std::size_t found;

	found = ret.find_last_not_of(pattern);
	if (found == std::string::npos) {
		ret.clear();
	} else {
		ret.erase(found + 1, ret.length() - found);
	}

	found = ret.find_first_not_of(pattern);
	if (found == std::string::npos) {
		ret.clear();
	} else {
		ret.erase(0, found);
	}

    return ret;
}